

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<void_(cv::Mat)>::ExplainMatchResultTo
          (TypedExpectation<void_(cv::Mat)> *this,ArgumentTuple *args,ostream *os)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  char *pcVar5;
  int iVar6;
  undefined1 local_1e8 [8];
  ExpectationSet unsatisfied_prereqs;
  string local_50;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  bVar1 = ExpectationBase::is_retired((ExpectationBase *)this);
  if (bVar1) {
    os = std::operator<<(os,"         Expected: the expectation is active\n");
    pcVar5 = "           Actual: it is retired\n";
LAB_001454b6:
    std::operator<<(os,pcVar5);
    return;
  }
  bVar1 = Matches(this,args);
  if (bVar1) {
    bVar1 = ExpectationBase::AllPrerequisitesAreSatisfied((ExpectationBase *)this);
    if (bVar1) {
      pcVar5 = "The call matches the expectation.\n";
      goto LAB_001454b6;
    }
    poVar3 = std::operator<<(os,"         Expected: all pre-requisites are satisfied\n");
    poVar3 = std::operator<<(poVar3,"           Actual: the following immediate pre-requisites ");
    std::operator<<(poVar3,"are not satisfied:\n");
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&unsatisfied_prereqs;
    unsatisfied_prereqs.expectations_._M_t._M_impl._0_4_ = 0;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    ExpectationBase::FindUnsatisfiedPrerequisites
              ((ExpectationBase *)this,(ExpectationSet *)local_1e8);
    iVar6 = 0;
    p_Var4 = unsatisfied_prereqs.expectations_._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent;
    while (p_Var4 != (_Rb_tree_node_base *)&unsatisfied_prereqs) {
      ExpectationBase::DescribeLocationTo(*(ExpectationBase **)(p_Var4 + 1),os);
      poVar3 = std::operator<<(os,"pre-requisite #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
      std::operator<<(poVar3,"\n");
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      iVar6 = iVar6 + 1;
    }
    std::operator<<(os,"                   (end of pre-requisites)\n");
    std::
    _Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
    ::~_Rb_tree((_Rb_tree<testing::Expectation,_testing::Expectation,_std::_Identity<testing::Expectation>,_testing::Expectation::Less,_std::allocator<testing::Expectation>_>
                 *)local_1e8);
  }
  else {
    bVar1 = TuplePrefix<1ul>::Matches<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
                      ((tuple<testing::Matcher<cv::Mat>_> *)(this + 0xf0),args);
    if (!bVar1) {
      TuplePrefix<1ul>::
      ExplainMatchFailuresTo<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
                ((tuple<testing::Matcher<cv::Mat>_> *)(this + 0xf0),args,os);
    }
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1e8);
    cVar2 = (**(code **)(**(long **)(this + 0x110) + 0x20))
                      (*(long **)(this + 0x110),args,(StringMatchResultListener *)local_1e8);
    if (cVar2 == '\0') {
      std::operator<<(os,"    Expected args: ");
      (**(code **)(**(long **)(this + 0x110) + 0x10))(*(long **)(this + 0x110),os);
      std::operator<<(os,"\n           Actual: don\'t match");
      std::__cxx11::stringbuf::str();
      PrintIfNotEmpty(&local_50,os);
      std::__cxx11::string::~string((string *)&local_50);
      std::operator<<(os,"\n");
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1e8);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    if (is_retired()) {
      *os << "         Expected: the expectation is active\n"
          << "           Actual: it is retired\n";
    } else if (!Matches(args)) {
      if (!TupleMatches(matchers_, args)) {
        ExplainMatchFailureTupleTo(matchers_, args, os);
      }
      StringMatchResultListener listener;
      if (!extra_matcher_.MatchAndExplain(args, &listener)) {
        *os << "    Expected args: ";
        extra_matcher_.DescribeTo(os);
        *os << "\n           Actual: don't match";

        internal::PrintIfNotEmpty(listener.str(), os);
        *os << "\n";
      }
    } else if (!AllPrerequisitesAreSatisfied()) {
      *os << "         Expected: all pre-requisites are satisfied\n"
          << "           Actual: the following immediate pre-requisites "
          << "are not satisfied:\n";
      ExpectationSet unsatisfied_prereqs;
      FindUnsatisfiedPrerequisites(&unsatisfied_prereqs);
      int i = 0;
      for (ExpectationSet::const_iterator it = unsatisfied_prereqs.begin();
           it != unsatisfied_prereqs.end(); ++it) {
        it->expectation_base()->DescribeLocationTo(os);
        *os << "pre-requisite #" << i++ << "\n";
      }
      *os << "                   (end of pre-requisites)\n";
    } else {
      // This line is here just for completeness' sake.  It will never
      // be executed as currently the ExplainMatchResultTo() function
      // is called only when the mock function call does NOT match the
      // expectation.
      *os << "The call matches the expectation.\n";
    }
  }